

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void allocate_mc_tmp_buf(AV1_COMMON *cm,ThreadData *thread_data,int buf_size,int use_highbd)

{
  void *__s;
  CONV_BUF_TYPE *pCVar1;
  uint8_t *puVar2;
  int i;
  size_t size;
  long lVar3;
  
  size = (size_t)buf_size;
  lVar3 = 0;
  do {
    if (use_highbd == 0) {
      puVar2 = (uint8_t *)aom_memalign(0x10,size);
      thread_data->mc_buf[lVar3] = puVar2;
      if (puVar2 == (uint8_t *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate thread_data->mc_buf[ref]");
      }
      memset(thread_data->mc_buf[lVar3],0,size);
    }
    else {
      __s = aom_memalign(0x10,size);
      if (__s == (void *)0x0) {
        aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate hbd_mc_buf");
      }
      memset(__s,0,size);
      thread_data->mc_buf[lVar3] = (uint8_t *)((ulong)__s >> 1);
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  thread_data->mc_buf_size = buf_size;
  thread_data->mc_buf_use_highbd = use_highbd;
  pCVar1 = (CONV_BUF_TYPE *)aom_memalign(0x20,0x8000);
  thread_data->tmp_conv_dst = pCVar1;
  if (pCVar1 == (CONV_BUF_TYPE *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate thread_data->tmp_conv_dst")
    ;
  }
  puVar2 = (uint8_t *)aom_memalign(0x10,0x8000);
  thread_data->seg_mask = puVar2;
  if (puVar2 == (uint8_t *)0x0) {
    aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,"Failed to allocate thread_data->seg_mask");
  }
  lVar3 = 0;
  do {
    puVar2 = (uint8_t *)aom_memalign(0x10,0x18000);
    thread_data->tmp_obmc_bufs[lVar3] = puVar2;
    if (puVar2 == (uint8_t *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate thread_data->tmp_obmc_bufs[i]");
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 == 1);
  return;
}

Assistant:

static inline void allocate_mc_tmp_buf(AV1_COMMON *const cm,
                                       ThreadData *thread_data, int buf_size,
                                       int use_highbd) {
  for (int ref = 0; ref < 2; ref++) {
    // The mc_buf/hbd_mc_buf must be zeroed to fix a intermittent valgrind error
    // 'Conditional jump or move depends on uninitialised value' from the loop
    // filter. Uninitialized reads in convolve function (e.g. horiz_4tap path in
    // av1_convolve_2d_sr_avx2()) from mc_buf/hbd_mc_buf are seen to be the
    // potential reason for this issue.
    if (use_highbd) {
      uint16_t *hbd_mc_buf;
      CHECK_MEM_ERROR(cm, hbd_mc_buf, (uint16_t *)aom_memalign(16, buf_size));
      memset(hbd_mc_buf, 0, buf_size);
      thread_data->mc_buf[ref] = CONVERT_TO_BYTEPTR(hbd_mc_buf);
    } else {
      CHECK_MEM_ERROR(cm, thread_data->mc_buf[ref],
                      (uint8_t *)aom_memalign(16, buf_size));
      memset(thread_data->mc_buf[ref], 0, buf_size);
    }
  }
  thread_data->mc_buf_size = buf_size;
  thread_data->mc_buf_use_highbd = use_highbd;

  CHECK_MEM_ERROR(cm, thread_data->tmp_conv_dst,
                  aom_memalign(32, MAX_SB_SIZE * MAX_SB_SIZE *
                                       sizeof(*thread_data->tmp_conv_dst)));
  CHECK_MEM_ERROR(cm, thread_data->seg_mask,
                  (uint8_t *)aom_memalign(
                      16, 2 * MAX_SB_SQUARE * sizeof(*thread_data->seg_mask)));

  for (int i = 0; i < 2; ++i) {
    CHECK_MEM_ERROR(
        cm, thread_data->tmp_obmc_bufs[i],
        aom_memalign(16, 2 * MAX_MB_PLANE * MAX_SB_SQUARE *
                             sizeof(*thread_data->tmp_obmc_bufs[i])));
  }
}